

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateCancelRequest(void)

{
  ImGuiWindow *pIVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiPopupData *pIVar5;
  ImRect child_rect;
  ImGuiWindow *parent_window;
  ImGuiWindow *child_window;
  bool nav_keyboard_active;
  bool nav_gamepad_active;
  ImGuiContext *g;
  ImGuiID id;
  uint3 in_stack_ffffffffffffffbc;
  uint uVar6;
  ImVec2 in_stack_ffffffffffffffc0;
  ImGuiNavLayer layer;
  undefined1 in_stack_ffffffffffffffd0 [16];
  undefined1 auVar7 [12];
  undefined8 in_stack_ffffffffffffffe0;
  ImGuiWindow *window;
  
  pIVar3 = GImGui;
  auVar7 = in_stack_ffffffffffffffd0._4_12_;
  uVar6 = (uint)in_stack_ffffffffffffffbc;
  if (((GImGui->IO).ConfigFlags & 2U) != 0) {
    uVar6 = CONCAT13(((GImGui->IO).BackendFlags & 1U) != 0,in_stack_ffffffffffffffbc);
  }
  uVar2 = uVar6 >> 0x18;
  if (((GImGui->IO).ConfigFlags & 1U) != 0) {
    bVar4 = IsKeyPressed((ImGuiKey)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0._12_4_,
                         in_stack_ffffffffffffffd0._8_4_);
    layer = auVar7._0_4_;
    if (bVar4) goto LAB_004e8d69;
  }
  layer = auVar7._0_4_;
  if ((char)uVar2 == '\0') {
    return;
  }
  bVar4 = IsKeyPressed((ImGuiKey)in_stack_ffffffffffffffe0,auVar7._8_4_,auVar7._4_4_);
  if (!bVar4) {
    return;
  }
LAB_004e8d69:
  if ((pIVar3->DebugLogFlags & 8U) != 0) {
    DebugLog("[nav] NavUpdateCancelRequest()\n");
  }
  if (pIVar3->ActiveId == 0) {
    if (pIVar3->NavLayer == ImGuiNavLayer_Main) {
      if ((((pIVar3->NavWindow == (ImGuiWindow *)0x0) ||
           (pIVar3->NavWindow == pIVar3->NavWindow->RootWindow)) ||
          ((pIVar3->NavWindow->Flags & 0x4000000U) != 0)) ||
         (pIVar3->NavWindow->ParentWindow == (ImGuiWindow *)0x0)) {
        if ((((pIVar3->OpenPopupStack).Size < 1) ||
            (pIVar5 = ImVector<ImGuiPopupData>::back(&pIVar3->OpenPopupStack),
            pIVar5->Window == (ImGuiWindow *)0x0)) ||
           (pIVar5 = ImVector<ImGuiPopupData>::back(&pIVar3->OpenPopupStack),
           (pIVar5->Window->Flags & 0x8000000U) != 0)) {
          if ((pIVar3->NavWindow != (ImGuiWindow *)0x0) &&
             (((pIVar3->NavWindow->Flags & 0x4000000U) != 0 ||
              ((pIVar3->NavWindow->Flags & 0x1000000U) == 0)))) {
            pIVar3->NavWindow->NavLastIds[0] = 0;
          }
          pIVar3->NavId = 0;
        }
        else {
          ClosePopupToLevel((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                            SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x18,0));
        }
      }
      else {
        pIVar1 = pIVar3->NavWindow;
        window = pIVar3->NavWindow->ParentWindow;
        ImGuiWindow::Rect((ImGuiWindow *)0x4e8e67);
        FocusWindow(window);
        id = pIVar1->ChildId;
        WindowRectAbsToRel((ImGuiWindow *)in_stack_ffffffffffffffc0,(ImRect *)CONCAT44(uVar6,id));
        SetNavID(id,ImGuiNavLayer_Main,0,(ImRect *)&stack0xffffffffffffffc0);
        NavRestoreHighlightAfterMove();
      }
    }
    else {
      NavRestoreLayer(layer);
      NavRestoreHighlightAfterMove();
    }
  }
  else {
    ClearActiveID();
  }
  return;
}

Assistant:

static void ImGui::NavUpdateCancelRequest()
{
    ImGuiContext& g = *GImGui;
    const bool nav_gamepad_active = (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad) != 0 && (g.IO.BackendFlags & ImGuiBackendFlags_HasGamepad) != 0;
    const bool nav_keyboard_active = (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) != 0;
    if (!(nav_keyboard_active && IsKeyPressed(ImGuiKey_Escape, ImGuiKeyOwner_None)) && !(nav_gamepad_active && IsKeyPressed(ImGuiKey_NavGamepadCancel, ImGuiKeyOwner_None)))
        return;

    IMGUI_DEBUG_LOG_NAV("[nav] NavUpdateCancelRequest()\n");
    if (g.ActiveId != 0)
    {
        ClearActiveID();
    }
    else if (g.NavLayer != ImGuiNavLayer_Main)
    {
        // Leave the "menu" layer
        NavRestoreLayer(ImGuiNavLayer_Main);
        NavRestoreHighlightAfterMove();
    }
    else if (g.NavWindow && g.NavWindow != g.NavWindow->RootWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_Popup) && g.NavWindow->ParentWindow)
    {
        // Exit child window
        ImGuiWindow* child_window = g.NavWindow;
        ImGuiWindow* parent_window = g.NavWindow->ParentWindow;
        IM_ASSERT(child_window->ChildId != 0);
        ImRect child_rect = child_window->Rect();
        FocusWindow(parent_window);
        SetNavID(child_window->ChildId, ImGuiNavLayer_Main, 0, WindowRectAbsToRel(parent_window, child_rect));
        NavRestoreHighlightAfterMove();
    }
    else if (g.OpenPopupStack.Size > 0 && g.OpenPopupStack.back().Window != NULL && !(g.OpenPopupStack.back().Window->Flags & ImGuiWindowFlags_Modal))
    {
        // Close open popup/menu
        ClosePopupToLevel(g.OpenPopupStack.Size - 1, true);
    }
    else
    {
        // Clear NavLastId for popups but keep it for regular child window so we can leave one and come back where we were
        if (g.NavWindow && ((g.NavWindow->Flags & ImGuiWindowFlags_Popup) || !(g.NavWindow->Flags & ImGuiWindowFlags_ChildWindow)))
            g.NavWindow->NavLastIds[0] = 0;
        g.NavId = 0;
    }
}